

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_copyin_str(char *s,void *v,size_t maxsz,nni_type t)

{
  size_t __n;
  size_t z;
  nni_type t_local;
  size_t maxsz_local;
  void *v_local;
  char *s_local;
  
  if (t == NNI_TYPE_STRING) {
    __n = nni_strnlen((char *)v,maxsz);
    if ((__n == maxsz) && (*(char *)((long)v + (maxsz - 1)) != '\0')) {
      s_local._4_4_ = 3;
    }
    else {
      memcpy(s,v,__n);
      s[__n] = '\0';
      s_local._4_4_ = 0;
    }
  }
  else {
    s_local._4_4_ = 0x1e;
  }
  return s_local._4_4_;
}

Assistant:

int
nni_copyin_str(char *s, const void *v, size_t maxsz, nni_type t)
{
	size_t z;

	if (t != NNI_TYPE_STRING) {
		return (NNG_EBADTYPE);
	}
	z = nni_strnlen(v, maxsz);
	if (z == maxsz && ((char *) v)[maxsz - 1] != 0) {
		return (NNG_EINVAL); // too long
	}
	memcpy(s, v, z);
	s[z] = 0;
	return (0);
}